

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O2

void anon_unknown.dwarf_1498d::SolverDpllTriadSimd<0>::AssertionsToEliminations
               (Cells16 *assertions,int box_i,int box_j,Cells16 *box_eliminations,
               Cells08 *h_band_eliminations,Cells08 *v_band_eliminations)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  auVar4 = _DAT_0010aaa0;
  auVar8 = vpand_avx2((anonymous_namespace)::tables._6016_32_,*(undefined1 (*) [32])assertions->vec)
  ;
  auVar3 = vpermq_avx2(auVar8,0x39);
  auVar6 = vprolq_avx512vl(auVar8,0x10);
  auVar3 = vpor_avx2(auVar3,auVar8);
  auVar7 = vpermq_avx2(auVar3,0x4e);
  auVar6 = vpor_avx2(auVar6,auVar8);
  auVar3 = vpor_avx2(auVar7,auVar3);
  auVar7 = vpshufb_avx2(auVar3,(anonymous_namespace)::tables._6048_32_);
  auVar9 = vpshufb_avx2(auVar3,(anonymous_namespace)::tables._6080_32_);
  auVar2 = vpshufd_avx2(auVar6,0xb1);
  auVar6 = vpor_avx2(auVar2,auVar6);
  auVar7 = vpternlogd_avx512vl(auVar9,auVar3,auVar7,0xfe);
  auVar3 = vpcmpgtw_avx2(auVar8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar6 = vpternlogd_avx512vl(auVar6,auVar7,auVar3,0xfe);
  auVar8 = vpternlogd_avx512vl(auVar8,auVar6,*(undefined1 (*) [32])box_eliminations->vec,0xbe);
  *(undefined1 (*) [32])box_eliminations->vec = auVar8;
  lVar5 = (long)(box_j * 3 + box_i) * 0x20;
  auVar8 = vpshufb_avx2(*(undefined1 (*) [32])assertions->vec,auVar4);
  auVar3 = vpshufb_avx2(auVar6,auVar4);
  auVar1 = vpor_avx(auVar8._16_16_,auVar8._0_16_);
  auVar7._0_16_ = ZEXT116(0) * *(undefined1 (*) [16])(assertions->vec + 2) + ZEXT116(1) * auVar1;
  auVar7._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(assertions->vec + 2);
  auVar1 = vpor_avx(auVar3._16_16_,auVar3._0_16_);
  auVar9._0_16_ = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar1;
  auVar9._16_16_ = ZEXT116(1) * auVar6._16_16_;
  auVar8 = vpshufb_avx2(auVar9,*(undefined1 (*) [32])
                                ((anonymous_namespace)::tables + lVar5 + 0x1480));
  auVar3 = vpshufb_avx2(auVar7,*(undefined1 (*) [32])
                                ((anonymous_namespace)::tables + lVar5 + 0x1360));
  auVar6 = vpshufb_avx2(auVar9,*(undefined1 (*) [32])
                                ((anonymous_namespace)::tables + lVar5 + 0x15a0));
  auVar8 = vpternlogd_avx512vl(auVar6,auVar3,auVar8,0xfe);
  auVar1 = vpor_avx(auVar8._0_16_,*(undefined1 (*) [16])h_band_eliminations->vec);
  *(undefined1 (*) [16])h_band_eliminations->vec = auVar1;
  auVar1 = vpor_avx(auVar8._16_16_,*(undefined1 (*) [16])v_band_eliminations->vec);
  *(undefined1 (*) [16])v_band_eliminations->vec = auVar1;
  return;
}

Assistant:

inline Bitvec16x16 operator&(const Bitvec16x16 &other) const {
        return _mm256_and_si256(vec, other.vec);
    }